

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

PortInfo kratos::InlineGeneratorVisitor::get_port_assignment(Port *port)

{
  PortDirection PVar1;
  long lVar2;
  _func_int **pp_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 extraout_var_01;
  long *plVar6;
  AssignStmt *pAVar7;
  PortInfo PVar8;
  
  PVar1 = port->direction_;
  iVar4 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xd])();
  lVar2 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x2d0);
  pp_Var3 = (port->super_Var).super_IRNode._vptr_IRNode;
  if (port->direction_ == In) {
    iVar4 = (*pp_Var3[0x10])(port);
    plVar6 = (long *)(CONCAT44(extraout_var_01,iVar4) + 0x10);
    pAVar7 = (AssignStmt *)0x0;
    while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
      if ((Port *)((long *)plVar6[1])[0x18] == port) {
        lVar5 = (**(code **)(*(long *)plVar6[1] + 0x20))();
        if (lVar5 == lVar2) {
          if (pAVar7 != (AssignStmt *)0x0) goto LAB_0020e9f9;
          pAVar7 = (AssignStmt *)plVar6[1];
        }
      }
    }
  }
  else {
    iVar4 = (*pp_Var3[0xe])();
    plVar6 = (long *)(CONCAT44(extraout_var_00,iVar4) + 0x10);
    pAVar7 = (AssignStmt *)0x0;
    while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
      if ((Port *)((long *)plVar6[1])[0x19] == port) {
        lVar5 = (**(code **)(*(long *)plVar6[1] + 0x20))();
        if (lVar5 == lVar2) {
          if (pAVar7 != (AssignStmt *)0x0) goto LAB_0020e9f9;
          pAVar7 = (AssignStmt *)plVar6[1];
        }
      }
    }
  }
LAB_0020e9fc:
  PVar8._4_4_ = 0;
  PVar8.direction = PVar1;
  PVar8.stmt = pAVar7;
  return PVar8;
LAB_0020e9f9:
  pAVar7 = (AssignStmt *)0x0;
  goto LAB_0020e9fc;
}

Assistant:

static PortInfo get_port_assignment(Port* port) {
        PortInfo info{port->port_direction(), nullptr};
        auto* gen_parent = port->generator()->parent_generator();
        if (port->port_direction() == PortDirection::In) {
            // assume we have handled the port decouple
            auto const& sources = port->sources();
            for (auto const& stmt : sources) {
                if (stmt->left() == port && stmt->parent() == gen_parent) {
                    if (info.stmt) {
                        // illegal state, return nothing just to be safe
                        info.stmt = nullptr;
                        return info;
                    }
                    info.stmt = stmt.get();
                }
            }
        } else {
            auto const& sinks = port->sinks();
            for (auto const& stmt : sinks) {
                if (stmt->right() == port && stmt->parent() == gen_parent) {
                    if (info.stmt) {
                        // illegal state, return nothing just to be safe
                        info.stmt = nullptr;
                        return info;
                    }
                    info.stmt = stmt.get();
                }
            }
        }
        return info;
    }